

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O1

bool __thiscall
Am_Image_Array_Data::Get_RGB_Image(Am_Image_Array_Data *this,uchar *storage,bool top_first)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Generic_Image *pAVar4;
  Am_RGB_Value *pAVar5;
  bool bVar6;
  uchar uVar7;
  bool bVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uchar *puVar21;
  uint uVar22;
  byte *pbVar23;
  
  if ((this->image_ != (Am_Generic_Image *)0x0) ||
     (bVar8 = make_generic_image_from_name(this), bVar8)) {
    pAVar4 = this->image_;
    pbVar10 = pAVar4->imdata;
    bVar8 = pbVar10 != (byte *)0x0;
    if (bVar8) {
      uVar2 = (pAVar4->iminfo).width;
      uVar11 = (ulong)uVar2;
      uVar3 = (pAVar4->iminfo).height;
      uVar14 = (ulong)uVar3;
      if (this->name == (char *)0x0) {
        uVar9 = uVar2 + 7 & 0xfffffff8;
        if (top_first) {
          if (uVar3 != 0) {
            iVar16 = 0;
            iVar17 = 0;
            uVar12 = 0;
            do {
              if (uVar11 != 0) {
                puVar21 = storage + (long)iVar17 + 2;
                iVar17 = iVar17 + (uint)uVar2 + (uint)uVar2 * 2;
                uVar22 = 0;
                do {
                  uVar7 = -((Get_RGB_Image::byte_array[uVar22 & 7] & pbVar10[iVar16 + uVar22 >> 3])
                           != 0);
                  puVar21[-2] = uVar7;
                  puVar21[-1] = uVar7;
                  *puVar21 = uVar7;
                  uVar22 = uVar22 + 1;
                  puVar21 = puVar21 + 3;
                } while (uVar2 != uVar22);
              }
              uVar12 = uVar12 + 1;
              iVar16 = iVar16 + uVar9;
            } while (uVar12 != uVar3);
          }
        }
        else if (uVar3 != 0) {
          iVar16 = (uVar3 - 1) * (uVar2 + 7 >> 3) * 8;
          iVar17 = 0;
          do {
            if (uVar2 != 0) {
              lVar18 = (long)iVar17;
              lVar20 = 0;
              iVar19 = iVar16;
              do {
                iVar13 = iVar19 + 7;
                if (-1 < iVar19) {
                  iVar13 = iVar19;
                }
                uVar7 = -((Get_RGB_Image::byte_array[iVar19 % 8] & pbVar10[iVar13 >> 3]) != 0);
                storage[lVar20 + lVar18] = uVar7;
                storage[lVar20 + lVar18 + 1] = uVar7;
                storage[lVar20 + lVar18 + 2] = uVar7;
                lVar20 = lVar20 + 3;
                iVar19 = iVar19 + 1;
              } while ((uint)uVar2 + (uint)uVar2 * 2 != (int)lVar20);
              iVar17 = iVar17 + (int)lVar20;
            }
            iVar19 = (int)uVar14;
            iVar16 = iVar16 - uVar9;
            uVar14 = (ulong)(iVar19 - 1);
          } while (1 < iVar19);
        }
        bVar8 = true;
      }
      else {
        pAVar5 = pAVar4->color_map;
        bVar8 = true;
        if (top_first) {
          if (uVar14 != 0) {
            uVar15 = 0;
            iVar16 = 0;
            do {
              if (uVar11 != 0) {
                lVar18 = (long)iVar16;
                lVar20 = 0;
                pbVar23 = pbVar10;
                do {
                  bVar1 = *pbVar23;
                  storage[lVar20 + lVar18] = (uchar)pAVar5[bVar1].red;
                  storage[lVar20 + lVar18 + 1] = (uchar)pAVar5[bVar1].green;
                  storage[lVar20 + lVar18 + 2] = (uchar)pAVar5[bVar1].blue;
                  lVar20 = lVar20 + 3;
                  pbVar23 = pbVar23 + 1;
                } while (uVar11 * 3 != lVar20);
                iVar16 = iVar16 + (int)lVar20;
              }
              uVar15 = uVar15 + 1;
              pbVar10 = pbVar10 + uVar11;
            } while (uVar15 != uVar14);
          }
        }
        else if (uVar14 != 0) {
          pbVar10 = pbVar10 + (uVar14 - 1) * uVar11;
          iVar16 = 0;
          do {
            if (uVar11 != 0) {
              lVar18 = (long)iVar16;
              lVar20 = 0;
              pbVar23 = pbVar10;
              do {
                bVar1 = *pbVar23;
                storage[lVar20 + lVar18] = (uchar)pAVar5[bVar1].red;
                storage[lVar20 + lVar18 + 1] = (uchar)pAVar5[bVar1].green;
                storage[lVar20 + lVar18 + 2] = (uchar)pAVar5[bVar1].blue;
                lVar20 = lVar20 + 3;
                pbVar23 = pbVar23 + 1;
              } while (uVar11 * 3 != lVar20);
              iVar16 = iVar16 + (int)lVar20;
            }
            pbVar10 = pbVar10 + -uVar11;
            bVar6 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar6);
        }
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool
Am_Image_Array_Data::Get_RGB_Image(unsigned char *storage, bool top_first)
{
  if (image_ == nullptr) {
    if (!make_generic_image_from_name())
      return false;
  }

  unsigned char *idata = image_->Get_Data();
  if (idata == nullptr)
    return false;

  unsigned short width, height;
  image_->Get_Size(width, height);

  if (name) {
    // image from file; with colormap
    Am_RGB_Value *ctbl;
    int row, col, index;

    (void)image_->Get_Color_Map(ctbl);
    index = 0;

    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    }
  } else {
    // image from bit data
    // this is how I think X stores bitmaps:
    // - the number of bits in a row is the width of the image is
    //   rounded up to an even multiple of 8
    // - the bits in a byte are stored from right to left !
    int row, col, index;
    static unsigned char byte_array[] = {0x01, 0x02, 0x04, 0x08,
                                         0x10, 0x20, 0x40, 0x80};
    int row_width = (width + 7) / 8 * 8; // round to nearest byte;

    index = 0;
    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    }
  }
  return true;
}